

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CArmInstruction.cpp
# Opt level: O1

bool __thiscall CArmInstruction::Validate(CArmInstruction *this,ValidateState *state)

{
  int *text;
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  byte bVar7;
  int *in_RCX;
  int *piVar8;
  uint uVar9;
  ExpressionValue *dest;
  ErrorType EVar10;
  char *pcVar11;
  uint uVar12;
  uint uVar13;
  ulong in_R8;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int num;
  ExpressionValue local_50;
  
  uVar6 = FileManager::getVirtualAddress(g_fileManager);
  this->RamPos = uVar6;
  (this->Vars).Opcode.UseNewEncoding = false;
  (this->Vars).Opcode.UseNewType = false;
  if ((uVar6 & 3) != 0) {
    Logger::queueError<>(Warning,"Opcode not word aligned");
  }
  if (((this->Vars).Shift.UseShift == true) && ((this->Vars).Shift.ShiftByRegister == false)) {
    bVar2 = Expression::evaluateInteger<int>
                      (&(this->Vars).Shift.ShiftExpression,&(this->Vars).Shift.ShiftAmount);
    if (bVar2) {
      bVar7 = (this->Vars).Shift.Type;
      local_50.type = (this->Vars).Shift.ShiftAmount;
      in_RCX = (int *)(ulong)local_50.type;
      if ((local_50.type == Invalid && bVar7 == 1) ||
         (local_50.type == Invalid && (bVar7 & 0xfe) == 2)) {
        bVar7 = 0;
LAB_00163152:
        in_RCX = (int *)(ulong)local_50.type;
        if (local_50.type < 0x21) {
          (this->Vars).Shift.FinalType = bVar7;
          (this->Vars).Shift.FinalShiftAmount = local_50.type;
          (this->Vars).Shift.UseFinal = true;
          goto LAB_00162fe1;
        }
      }
      else {
        if (local_50.type == 0x20 && bVar7 == 1) {
          local_50.type = Invalid;
          bVar7 = 1;
          goto LAB_00163152;
        }
        if (bVar7 == 2 && local_50.type == 0x20) {
          local_50.type = Invalid;
          bVar7 = 2;
          goto LAB_00163152;
        }
        if (bVar7 != 0 || local_50.type != 0x20) {
          if (bVar7 == 4) {
            if (local_50.type != Integer) {
              pcVar11 = "Invalid shift mode";
              goto LAB_0016317d;
            }
            local_50.type = Invalid;
            bVar7 = 3;
          }
          goto LAB_00163152;
        }
      }
      EVar10 = 0x190183;
      dest = &local_50;
      goto LAB_0016316c;
    }
LAB_00163176:
    pcVar11 = "Invalid expression";
LAB_0016317d:
    Logger::queueError<>(Error,pcVar11);
    return false;
  }
LAB_00162fe1:
  if (((this->Opcode).flags & 0x400000) != 0) {
    dest = (ExpressionValue *)&(this->Vars).CopData.Cpop;
    bVar2 = Expression::evaluateInteger<int>(&(this->Vars).CopData.CpopExpression,(int *)dest);
    if (!bVar2) goto LAB_00163176;
    if (0xf < *(int *)dest) {
      EVar10 = 0x1901b7;
      goto LAB_0016316c;
    }
  }
  if (((this->Opcode).flags & 0x800000) != 0) {
    dest = (ExpressionValue *)&(this->Vars).CopData.Cpinf;
    bVar2 = Expression::evaluateInteger<int>(&(this->Vars).CopData.CpinfExpression,(int *)dest);
    if (!bVar2) goto LAB_00163176;
    if (7 < *(int *)dest) {
      EVar10 = 0x1901d2;
LAB_0016316c:
      Logger::queueError<int>((Logger *)0x1,EVar10,(char *)dest,in_RCX);
      return false;
    }
  }
  if (((this->Opcode).flags & 0x1000000) != 0) {
    std::__cxx11::string::_M_assign((string *)&(this->Vars).rn);
    (this->Vars).rn.num = (this->Vars).rd.num;
  }
  if (((this->Opcode).flags & 0x2000000) != 0) {
    std::__cxx11::string::_M_assign((string *)&(this->Vars).rm);
    (this->Vars).rm.num = (this->Vars).rd.num;
  }
  uVar6 = (this->Opcode).flags;
  if ((((uint)uVar6 >> 0x1b & 1) != 0) && (((this->Vars).rd.num & 1) != 0)) {
    pcVar11 = "rd must be even";
    goto LAB_0016317d;
  }
  if ((uVar6 & 0x20) == 0) goto LAB_001636fc;
  Expression::evaluate(&local_50,&(this->Vars).ImmediateExpression);
  if (local_50.type == Float) {
    if (((this->Opcode).flags & 0x18000) == 0) goto LAB_00163248;
    local_50.field_1.intValue._0_4_ =
         getFloatBits((float)(double)CONCAT44(local_50.field_1.intValue._4_4_,
                                              local_50.field_1.intValue._0_4_));
LAB_001631c1:
    (this->Vars).Immediate = local_50.field_1.intValue._0_4_;
    (this->Vars).OriginalImmediate = local_50.field_1.intValue._0_4_;
    (this->Vars).negative = false;
    FileManager::advanceMemory(g_fileManager,4);
    text = &(this->Vars).OriginalImmediate;
    uVar6 = (this->Opcode).flags;
    uVar12 = (uint)uVar6;
    if ((short)uVar6 < 0) {
      (this->Vars).negative = false;
      if (((uVar12 >> 0x11 & 1) != 0) && (iVar5 = (this->Vars).Immediate, iVar5 < 0)) {
        (this->Vars).Immediate = -iVar5;
        (this->Vars).negative = true;
      }
      if ((uVar6 >> 0x20 & 1) != 0) {
        iVar5 = ((this->Vars).Immediate - ((uint)this->RamPos & 0xfffffffc)) + -8;
        (this->Vars).Immediate = iVar5;
        if (iVar5 < 0) {
          (this->Vars).Opcode.NewEncoding = (this->Opcode).encoding ^ 0xc00000;
          (this->Vars).Opcode.UseNewEncoding = true;
          (this->Vars).Immediate = -iVar5;
        }
      }
      uVar4 = (this->Vars).Immediate;
      uVar16 = 0;
      uVar14 = 0;
      do {
        uVar9 = uVar16 & 0x1e;
        uVar15 = -0x100 << (sbyte)uVar9 | 0xffffff00U >> ((byte)uVar14 & 0x1f);
        if ((uVar15 & uVar4) == 0) {
          (this->Vars).Shift.ShiftAmount = uVar14;
          in_R8 = (ulong)(uVar4 >> (sbyte)uVar9 | uVar4 << ((byte)uVar14 & 0x1f));
        }
        uVar13 = (uint)in_R8;
        if ((uVar15 & uVar4) == 0) goto LAB_00163323;
        uVar9 = uVar14 + 2;
        uVar16 = uVar16 - 2;
        bVar2 = uVar14 < 0x1e;
        uVar14 = uVar9;
      } while (bVar2);
      uVar13 = 0xffffffff;
LAB_00163323:
      piVar8 = (int *)(ulong)uVar9;
      if (uVar13 == 0xffffffff) {
        uVar13 = 0xffffffff;
        if ((uVar12 >> 0x1c & 1) != 0) {
          uVar14 = (this->Opcode).encoding;
          if ((uVar12 >> 0x1d & 1) == 0) {
            if ((uVar12 >> 0x1e & 1) != 0) {
              uVar14 = uVar14 ^ 0x1c00000;
              goto LAB_00163614;
            }
            if ((int)uVar12 < 0) {
              uVar14 = uVar14 ^ 0x200000;
LAB_00163744:
              uVar4 = -uVar4;
            }
            else if ((uVar6 >> 0x21 & 1) != 0) {
              uVar14 = uVar14 ^ 0xc00000;
              goto LAB_00163744;
            }
          }
          else {
            uVar14 = uVar14 ^ 0x400000;
LAB_00163614:
            uVar4 = ~uVar4;
          }
          uVar16 = 0;
          uVar12 = 0;
          do {
            uVar9 = uVar16 & 0x1e;
            uVar15 = -0x100 << (sbyte)uVar9 | 0xffffff00U >> ((byte)uVar12 & 0x1f);
            if ((uVar15 & uVar4) == 0) {
              (this->Vars).Shift.ShiftAmount = uVar12;
              uVar13 = uVar4 >> (sbyte)uVar9 | uVar4 << ((byte)uVar12 & 0x1f);
            }
            if ((uVar15 & uVar4) == 0) goto LAB_0016366b;
            uVar9 = uVar12 + 2;
            uVar16 = uVar16 - 2;
            bVar2 = uVar12 < 0x1e;
            uVar12 = uVar9;
          } while (bVar2);
          uVar13 = 0xffffffff;
LAB_0016366b:
          piVar8 = (int *)(ulong)uVar9;
          if (uVar13 != 0xffffffff) {
            (this->Vars).Opcode.NewEncoding = uVar14;
            (this->Vars).Opcode.UseNewEncoding = true;
          }
        }
        if (uVar13 == 0xffffffff) {
          bVar2 = true;
          Logger::queueError<int>((Logger *)0x1,0x190215,(char *)text,piVar8);
          bVar1 = true;
          goto LAB_001636dc;
        }
      }
LAB_00163683:
      (this->Vars).Immediate = uVar13;
    }
    else if ((uVar12 >> 0x10 & 1) == 0) {
      if ((uVar12 >> 0x12 & 1) != 0) {
        uVar12 = (this->Vars).Immediate;
        if ((char)uVar6 < '\0') {
          if ((uVar12 & 1) == 0) goto LAB_0016355d;
          pcVar11 = "Branch target must be halfword aligned";
        }
        else {
          if ((uVar12 & 3) == 0) {
LAB_0016355d:
            uVar4 = ((this->Vars).Immediate - (int)this->RamPos) - 8;
            (this->Vars).Immediate = uVar4;
            uVar12 = -uVar4;
            if (0 < (int)uVar4) {
              uVar12 = uVar4;
            }
            piVar8 = (int *)(ulong)uVar12;
            if (0x1ffffff < uVar12) {
              EVar10 = 0x18fa72;
              goto LAB_0016358c;
            }
            goto LAB_0016368a;
          }
          pcVar11 = "Branch target must be word aligned";
        }
        bVar2 = true;
        Logger::queueError<>(Error,pcVar11);
        bVar1 = true;
        goto LAB_001636dc;
      }
      if ((uVar12 >> 0x13 & 1) == 0) {
        if ((uVar12 >> 0x15 & 1) == 0) {
          if (((uVar12 >> 0x11 & 1) != 0) && (iVar5 = (this->Vars).Immediate, iVar5 < 0)) {
            (this->Vars).Immediate = -iVar5;
            (this->Vars).negative = true;
          }
        }
        else if ((this->arch < AARCH_3DS) && (iVar5 = (this->Vars).Immediate, iVar5 < 0xff)) {
          iVar5 = iVar5 << 0x10;
          (this->Vars).Immediate = iVar5;
          (this->Vars).OriginalImmediate = iVar5;
        }
      }
      else {
        iVar3 = ((this->Vars).Immediate - (int)this->RamPos) + -8;
        iVar5 = -iVar3;
        if (0 < iVar3) {
          iVar5 = iVar3;
        }
        (this->Vars).Immediate = iVar3;
        bVar7 = (byte)(this->Vars).ImmediateBitLen;
        piVar8 = (int *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar7);
        if (1 << (bVar7 & 0x1f) <= iVar5) {
          EVar10 = 0x190234;
LAB_0016358c:
          bVar2 = true;
          Logger::queueError<int>((Logger *)0x1,EVar10,(char *)text,piVar8);
          bVar1 = true;
          goto LAB_001636dc;
        }
      }
    }
    else {
      uVar12 = (this->Vars).Immediate;
      uVar13 = 0;
      uVar4 = 0;
      do {
        bVar7 = (byte)uVar13 & 0x1e;
        uVar14 = -0x100 << bVar7 | 0xffffff00U >> ((byte)uVar4 & 0x1f);
        if ((uVar14 & uVar12) == 0) {
          (this->Vars).Shift.ShiftAmount = uVar4;
          uVar6 = (ulong)(uVar12 >> bVar7 | uVar12 << ((byte)uVar4 & 0x1f));
        }
        iVar5 = (int)uVar6;
        if ((uVar14 & uVar12) == 0) goto LAB_001633fa;
        uVar13 = uVar13 - 2;
        bVar2 = uVar4 < 0x1e;
        uVar4 = uVar4 + 2;
      } while (bVar2);
      iVar5 = -1;
LAB_001633fa:
      if (iVar5 == -1) {
        uVar14 = ~uVar12;
        bVar7 = 0;
        uVar4 = 0;
        do {
          uVar16 = -0x100 << (bVar7 & 0x1e) | 0xffffff00U >> ((byte)uVar4 & 0x1f);
          if ((uVar16 & uVar14) == 0) {
            (this->Vars).Shift.ShiftAmount = uVar4;
            uVar13 = uVar14 >> (bVar7 & 0x1e) | uVar14 << ((byte)uVar4 & 0x1f);
          }
          if ((uVar16 & uVar14) == 0) goto LAB_001634fb;
          bVar7 = bVar7 - 2;
          bVar2 = uVar4 < 0x1e;
          uVar4 = uVar4 + 2;
        } while (bVar2);
        uVar13 = 0xffffffff;
LAB_001634fb:
        if (uVar13 != 0xffffffff) {
          (this->Vars).Opcode.NewEncoding = 0x3e00000;
          (this->Vars).Opcode.NewType = '\x02';
          (this->Vars).Opcode.UseNewEncoding = true;
          (this->Vars).Opcode.UseNewType = true;
          goto LAB_00163683;
        }
        CArmArchitecture::addPoolValue(&Arm,&this->super_ArmOpcodeCommand,uVar12);
      }
      else {
        (this->Vars).Opcode.NewEncoding = 0x3a00000;
        (this->Vars).Opcode.NewType = '\x02';
        (this->Vars).Opcode.UseNewEncoding = true;
        (this->Vars).Opcode.UseNewType = true;
        (this->Vars).Immediate = iVar5;
      }
    }
LAB_0016368a:
    uVar12 = (this->Vars).ImmediateBitLen;
    bVar1 = true;
    if ((uVar12 != 0x20) && (uVar4 = (uint)(this->Opcode).flags, (uVar4 >> 0x13 & 1) == 0)) {
      uVar14 = (this->Vars).Immediate;
      uVar16 = -uVar14;
      if (0 < (int)uVar14) {
        uVar16 = uVar14;
      }
      if ((uVar4 >> 0x11 & 1) == 0) {
        uVar16 = uVar14;
      }
      if (uVar16 >> ((byte)uVar12 & 0x1f) != 0) {
        bVar2 = true;
        Logger::queueError<int>((Logger *)0x1,0x190252,(char *)text,(int *)(ulong)uVar12);
        bVar1 = true;
        goto LAB_001636dc;
      }
    }
    bVar2 = false;
  }
  else {
    if (local_50.type == Integer) goto LAB_001631c1;
LAB_00163248:
    Logger::queueError<>(Error,"Invalid expression type");
    bVar2 = true;
    bVar1 = false;
  }
LAB_001636dc:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.strValue._value._M_dataplus._M_p != &local_50.strValue._value.field_2) {
    operator_delete(local_50.strValue._value._M_dataplus._M_p,
                    local_50.strValue._value.field_2._M_allocated_capacity + 1);
  }
  if (bVar2 || bVar1) {
    return false;
  }
LAB_001636fc:
  FileManager::advanceMemory(g_fileManager,4);
  return false;
}

Assistant:

bool CArmInstruction::Validate(const ValidateState &state)
{
	RamPos = g_fileManager->getVirtualAddress();

	Vars.Opcode.UseNewEncoding = false;
	Vars.Opcode.UseNewType = false;


	if (RamPos & 3)
	{
		Logger::queueError(Logger::Warning, "Opcode not word aligned");
	}

	if (Vars.Shift.UseShift && !Vars.Shift.ShiftByRegister)
	{
		if (!Vars.Shift.ShiftExpression.evaluateInteger(Vars.Shift.ShiftAmount))
		{
			Logger::queueError(Logger::Error, "Invalid expression");
			return false;
		}

		int mode = Vars.Shift.Type;
		int num = Vars.Shift.ShiftAmount;

		if (num == 0 && mode == ARM_SHIFT_LSR) mode = ARM_SHIFT_LSL;
		else if (num == 0 && mode == ARM_SHIFT_ASR) mode = ARM_SHIFT_LSL;
		else if (num == 0 && mode == ARM_SHIFT_ROR) mode = ARM_SHIFT_LSL;
		else if (num == 32 && mode == ARM_SHIFT_LSR) num = 0;
		else if (num == 32 && mode == ARM_SHIFT_ASR) num = 0;
		else if (num == 32 && mode == ARM_SHIFT_LSL)
		{
			Logger::queueError(Logger::Error, "Shift amount 0x%02X out of range",num);
			return false;
		} else if (mode == ARM_SHIFT_RRX)
		{
			if (num != 1)
			{
				Logger::queueError(Logger::Error, "Invalid shift mode");
				return false;
			}
			mode = ARM_SHIFT_ROR;
			num = 0;
		}

		if (num > 32 || num < 0)
		{
			Logger::queueError(Logger::Error, "Shift amount 0x%02X out of range",num);
			return false;
		}

		Vars.Shift.FinalType = mode;
		Vars.Shift.FinalShiftAmount = num;
		Vars.Shift.UseFinal = true;
	}

	if (Opcode.flags & ARM_COPOP)
	{
		if (!Vars.CopData.CpopExpression.evaluateInteger(Vars.CopData.Cpop))
		{
			Logger::queueError(Logger::Error, "Invalid expression");
			return false;
		}

		if (Vars.CopData.Cpop > 15)
		{
			Logger::queueError(Logger::Error, "CP Opc number %02X too big",Vars.CopData.Cpop);
			return false;
		}
	}

	if (Opcode.flags & ARM_COPINF)
	{
		if (!Vars.CopData.CpinfExpression.evaluateInteger(Vars.CopData.Cpinf))
		{
			Logger::queueError(Logger::Error, "Invalid expression");
			return false;
		}

		if (Vars.CopData.Cpinf > 7)
		{
			Logger::queueError(Logger::Error, "CP Inf number %02X too big",Vars.CopData.Cpinf);
			return false;
		}
	}

	if (Opcode.flags & ARM_DN)
	{
		Vars.rn = Vars.rd;
	}

	if (Opcode.flags & ARM_DM)
	{
		Vars.rm = Vars.rd;
	}

	if (Opcode.flags & ARM_RDEVEN)
	{
		if (Vars.rd.num & 1)
		{
			Logger::queueError(Logger::Error, "rd must be even");
			return false;
		}
	}

	bool memoryAdvanced = false;
	if (Opcode.flags & ARM_IMMEDIATE)
	{
		ExpressionValue value = Vars.ImmediateExpression.evaluate();

		switch (value.type)
		{
		case ExpressionValueType::Integer:
			Vars.Immediate = (int) value.intValue;
			break;
		case ExpressionValueType::Float:
			if (!(Opcode.flags & ARM_SHIFT) && !(Opcode.flags & ARM_POOL))
			{
				Logger::queueError(Logger::Error, "Invalid expression type");
				return false;
			}

			Vars.Immediate = (int) getFloatBits((float)value.floatValue);
			break;
		default:
			Logger::queueError(Logger::Error, "Invalid expression type");
			return false;
		}

		Vars.OriginalImmediate = Vars.Immediate;
		Vars.negative = false;
		
		g_fileManager->advanceMemory(4);
		memoryAdvanced = true;

		if (Opcode.flags & ARM_SHIFT)	// shifted immediate, eg 4000h
		{
			int temp;
			Vars.negative = false;
			if ((Opcode.flags & ARM_ABS) && Vars.Immediate < 0)
			{
				Vars.Immediate = abs(Vars.Immediate);
				Vars.negative = true;
			}

			if (Opcode.flags & ARM_PCR)
			{
				Vars.Immediate = Vars.Immediate - ((RamPos+8) & ~3);
				if (Vars.Immediate < 0)
				{
					Vars.Opcode.NewEncoding = Opcode.encoding ^ 0xC00000;
					Vars.Opcode.UseNewEncoding = true;
					Vars.Immediate = abs(Vars.Immediate);
				}
			}

			if ((temp = getShiftedImmediate(Vars.Immediate,Vars.Shift.ShiftAmount)) == -1)
			{
				// mov/mvn -> mvn/mov
				if ((Opcode.flags & ARM_OPTIMIZE))
				{
					auto encoding = Opcode.encoding;
					auto immediate = Vars.Immediate;

					if (Opcode.flags & ARM_OPMOVMVN)
					{
						encoding ^= 0x0400000;
						immediate = ~immediate;
					}
					else if (Opcode.flags & ARM_OPANDBIC)
					{
						encoding ^= 0x1C00000;
						immediate = ~immediate;
					}
					else if (Opcode.flags & ARM_OPCMPCMN)
					{
						encoding ^= 0x0200000;
						immediate = 0-immediate;
					}
					else if (Opcode.flags & ARM_OPADDSUB)
					{
						encoding ^= 0x0C00000;
						immediate = 0-immediate;
					}

					temp = getShiftedImmediate(immediate, Vars.Shift.ShiftAmount);
					if (temp != -1)
					{
						Vars.Opcode.NewEncoding = encoding;
						Vars.Opcode.UseNewEncoding = true;
					}
				}
				if (temp == -1)
				{
					// If we get here then the instruction did not contain a shifted immediate
					// and we failed to optimize into another instruction
					Logger::queueError(Logger::Error, "Invalid shifted immediate 0x%X", Vars.OriginalImmediate);
					return false;
				}
			}
			Vars.Immediate = temp;
		} else if (Opcode.flags & ARM_POOL)
		{
			int temp;

			if ((temp = getShiftedImmediate(Vars.Immediate,Vars.Shift.ShiftAmount)) != -1)
			{
				// interpete ldr= as mov
				Vars.Opcode.NewEncoding = 0x03A00000;
				Vars.Opcode.UseNewEncoding = true;
				Vars.Opcode.NewType = ARM_TYPE5;
				Vars.Opcode.UseNewType = true;
				Vars.Immediate = temp;
			} else if ((temp = getShiftedImmediate(~Vars.Immediate,Vars.Shift.ShiftAmount)) != -1) 
			{
				// interprete ldr= as mvn
				Vars.Opcode.NewEncoding = 0x03E00000;
				Vars.Opcode.UseNewEncoding = true;
				Vars.Opcode.NewType = ARM_TYPE5;
				Vars.Opcode.UseNewType = true;
				Vars.Immediate = temp;
			} else {
				Arm.addPoolValue(this,Vars.Immediate);
			}
		} else if (Opcode.flags & ARM_BRANCH)
		{
			if (Opcode.flags & ARM_HALFWORD)
			{
				if (Vars.Immediate & 1)
				{
					Logger::queueError(Logger::Error, "Branch target must be halfword aligned");
					return false;
				}
			} else {
				if (Vars.Immediate & 3)
				{
					Logger::queueError(Logger::Error, "Branch target must be word aligned");
					return false;
				}
			}

			Vars.Immediate = (int) (Vars.Immediate-RamPos-8);
			if (abs(Vars.Immediate) >= 0x2000000)
			{
				Logger::queueError(Logger::Error, "Branch target %08X out of range",Vars.OriginalImmediate);
				return false;
			}
		} else if (Opcode.flags & ARM_ABSIMM)	// ldr r0,[I]
		{
			Vars.Immediate = (int) (Vars.Immediate-RamPos-8);
			if (abs(Vars.Immediate) >= (1 << Vars.ImmediateBitLen))
			{
				Logger::queueError(Logger::Error, "Load target %08X out of range",Vars.OriginalImmediate);
				return false;
			}
		} else if (Opcode.flags & ARM_SWI)	// it's an interrupt, may need to shift it
		{
			bool needsShift = arch == AARCH_GBA || arch == AARCH_NDS;
			if (needsShift && Vars.Immediate < 0xFF)
			{
				Vars.Immediate <<= 16;
				Vars.OriginalImmediate = Vars.Immediate;
			}
		} else if ((Opcode.flags & ARM_ABS) && Vars.Immediate < 0)
		{
			Vars.Immediate = abs(Vars.Immediate);
			Vars.negative = true;
		}

		if (Vars.ImmediateBitLen != 32 && !(Opcode.flags & ARM_ABSIMM))
		{
			unsigned int check = Opcode.flags & ARM_ABS ? abs(Vars.Immediate) : Vars.Immediate;
			if (check >= (unsigned int)(1 << Vars.ImmediateBitLen))
			{
				Logger::queueError(Logger::Error, "Immediate value %X out of range",Vars.OriginalImmediate);
				return false;
			}
		}
	}
	
	if (!memoryAdvanced)
		g_fileManager->advanceMemory(4);

	return false;
}